

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  size_t __n;
  blake2s_state *pbVar2;
  void *pin;
  long lVar3;
  size_t sVar4;
  ulong inlen_00;
  size_t sVar5;
  long lVar6;
  blake2s_state FS [1];
  uint8_t hash [8] [32];
  blake2s_state S [8] [1];
  
  if ((out != (void *)0x0) && (in != (void *)0x0 || inlen == 0)) {
    if ((keylen < 0x21) &&
       ((0xffffffffffffffdf < outlen - 0x21 && (key != (void *)0x0 || keylen == 0)))) {
      pbVar2 = S[0];
      lVar3 = 0;
      do {
        if (lVar3 == 8) {
          S[7][0].last_node = '\x01';
          if (keylen != 0) {
            sVar5 = 0;
            __n = -(keylen - 0x40);
            if (0x3f < keylen) {
              __n = sVar5;
            }
            memset(hash[0] + keylen,0,__n);
            memcpy(hash,key,keylen);
            for (; sVar5 != 0x440; sVar5 = sVar5 + 0x88) {
              blake2s_update((blake2s_state *)((long)S[0][0].h + sVar5),hash,0x40);
            }
            memset(hash,0,0x40);
          }
          lVar6 = 0;
          for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
            pin = (void *)((long)in + lVar3 * 0x40);
            pbVar2 = S[lVar3];
            for (sVar4 = inlen; 0x1ff < sVar4; sVar4 = sVar4 - 0x200) {
              blake2s_update(pbVar2,pin,0x40);
              pin = (void *)((long)pin + 0x200);
            }
            if ((ulong)(lVar3 * 0x40) < sVar4) {
              inlen_00 = sVar4 + lVar6;
              if (0x3f < sVar4 + lVar6) {
                inlen_00 = 0x40;
              }
              blake2s_update(pbVar2,pin,inlen_00);
            }
            blake2s_final(pbVar2,hash + lVar3,0x20);
            lVar6 = lVar6 + -0x40;
          }
          iVar1 = blake2sp_init_root(FS,outlen,keylen);
          if (-1 < iVar1) {
            FS[0].last_node = '\x01';
            for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 0x20) {
              blake2s_update(FS,hash[0] + lVar3,0x20);
            }
            iVar1 = blake2s_final(FS,out,outlen);
            return iVar1;
          }
          return -1;
        }
        iVar1 = blake2sp_init_leaf(pbVar2,outlen,keylen,(uint32_t)lVar3);
        lVar3 = lVar3 + 1;
        pbVar2 = pbVar2 + 1;
      } while (-1 < iVar1);
    }
  }
  return -1;
}

Assistant:

int blake2sp( void *out, size_t outlen, const void *in, size_t inlen, const void *key, size_t keylen )
{
  uint8_t hash[PARALLELISM_DEGREE][BLAKE2S_OUTBYTES];
  blake2s_state S[PARALLELISM_DEGREE][1];
  blake2s_state FS[1];
  size_t i;

  /* Verify parameters */
  if ( NULL == in && inlen > 0 ) return -1;

  if ( NULL == out ) return -1;

  if ( NULL == key && keylen > 0) return -1;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( keylen > BLAKE2S_KEYBYTES ) return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S[i], outlen, keylen, (uint32_t)i ) < 0 ) return -1;

  S[PARALLELISM_DEGREE - 1]->last_node = 1; /* mark last node */

  if( keylen > 0 )
  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S[i], block, BLAKE2S_BLOCKBYTES );

    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }

#if defined(_OPENMP)
  #pragma omp parallel shared(S,hash), num_threads(PARALLELISM_DEGREE)
#else

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
#endif
  {
#if defined(_OPENMP)
    size_t      i = omp_get_thread_num();
#endif
    size_t inlen__ = inlen;
    const unsigned char *in__ = ( const unsigned char * )in;
    in__ += i * BLAKE2S_BLOCKBYTES;

    while( inlen__ >= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES )
    {
      blake2s_update( S[i], in__, BLAKE2S_BLOCKBYTES );
      in__ += PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
      inlen__ -= PARALLELISM_DEGREE * BLAKE2S_BLOCKBYTES;
    }

    if( inlen__ > i * BLAKE2S_BLOCKBYTES )
    {
      const size_t left = inlen__ - i * BLAKE2S_BLOCKBYTES;
      const size_t len = left <= BLAKE2S_BLOCKBYTES ? left : BLAKE2S_BLOCKBYTES;
      blake2s_update( S[i], in__, len );
    }

    blake2s_final( S[i], hash[i], BLAKE2S_OUTBYTES );
  }

  if( blake2sp_init_root( FS, outlen, keylen ) < 0 )
    return -1;

  FS->last_node = 1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    blake2s_update( FS, hash[i], BLAKE2S_OUTBYTES );

  return blake2s_final( FS, out, outlen );
}